

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

void __thiscall
QNetworkHeadersPrivate::setHeaders(QNetworkHeadersPrivate *this,QHttpHeaders *newHeaders)

{
  QHttpHeadersPrivate *pQVar1;
  
  pQVar1 = (this->httpHeaders).d.d.ptr;
  (this->httpHeaders).d.d.ptr = (newHeaders->d).d.ptr;
  (newHeaders->d).d.ptr = pQVar1;
  setCookedFromHttp(this,&this->httpHeaders);
  invalidateHeaderCache(this);
  return;
}

Assistant:

void QNetworkHeadersPrivate::setHeaders(QHttpHeaders &&newHeaders)
{
    httpHeaders = std::move(newHeaders);
    setCookedFromHttp(httpHeaders);
    invalidateHeaderCache();
}